

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O0

void Mtr_MakeFirstChild(MtrNode *parent,MtrNode *child)

{
  MtrNode *child_local;
  MtrNode *parent_local;
  
  child->parent = parent;
  child->younger = parent->child;
  child->elder = (MtrNode *)0x0;
  if (parent->child != (MtrNode *)0x0) {
    parent->child->elder = child;
  }
  parent->child = child;
  return;
}

Assistant:

void
Mtr_MakeFirstChild(
  MtrNode * parent,
  MtrNode * child)
{
    child->parent = parent;
    child->younger = parent->child;
    child->elder = NULL;
    if (parent->child != NULL) {
#ifdef MTR_DEBUG
        assert(parent->child->elder == NULL);
#endif
        parent->child->elder = child;
    }
    parent->child = child;
    return;

}